

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void makeTokenMap(UDataSwapper *ds,int16_t *tokens,uint16_t tokenCount,uint8_t *map,
                 UErrorCode *pErrorCode)

{
  long lVar1;
  uint uVar2;
  undefined6 in_register_00000012;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint8_t c1;
  uint8_t c2;
  UBool usedOutChar [256];
  byte local_142;
  byte local_141;
  undefined4 local_140;
  undefined4 local_13c;
  char local_138 [264];
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return;
  }
  if (ds->inCharset == ds->outCharset) {
    lVar1 = 0;
    do {
      map[lVar1] = (uint8_t)lVar1;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x100);
  }
  else {
    memset(map,0,0x100);
    memset(local_138,0,0x100);
    local_13c = (undefined4)CONCAT62(in_register_00000012,tokenCount);
    local_140 = local_13c;
    if (0xff < tokenCount) {
      local_140 = 0x100;
    }
    if (1 < tokenCount) {
      uVar3 = (ulong)(ushort)local_140;
      uVar7 = 1;
      do {
        if (tokens[uVar7] == -1) {
          local_142 = (byte)uVar7;
          (*ds->swapInvChars)(ds,&local_142,1,&local_141,pErrorCode);
          if (U_ZERO_ERROR < *pErrorCode) {
            udata_printError_63(ds,
                                "unames/makeTokenMap() finds variant character 0x%02x used (input charset family %d)\n"
                                ,uVar7 & 0xffffffff,(ulong)ds->inCharset);
            return;
          }
          map[local_142] = local_141;
          local_138[local_141] = '\x01';
        }
        uVar7 = uVar7 + 1;
      } while (uVar3 != uVar7);
    }
    if (1 < (ushort)local_13c) {
      uVar2 = 1;
      uVar3 = 1;
      do {
        if (map[uVar3] == '\0') {
          uVar5 = uVar2 - 1;
          do {
            uVar6 = uVar2 & 0xffff;
            uVar2 = uVar2 + 1;
            bVar4 = (char)uVar5 + 1;
            uVar5 = (uint)bVar4;
          } while (local_138[uVar6] != '\0');
          map[uVar3] = bVar4;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 != (ushort)local_140);
    }
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }